

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::getiOSVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  OSType OVar1;
  ArchType AVar2;
  uint uVar3;
  uint *Micro_local;
  uint *Minor_local;
  uint *Major_local;
  Triple *this_local;
  
  OVar1 = getOS(this);
  switch(OVar1) {
  case Darwin:
  case MacOSX:
    *Major = 5;
    *Minor = 0;
    *Micro = 0;
    break;
  default:
    llvm_unreachable_internal
              ("unexpected OS for Darwin triple",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x42e);
  case IOS:
  case TvOS:
    getOSVersion(this,Major,Minor,Micro);
    if (*Major == 0) {
      AVar2 = getArch(this);
      uVar3 = 5;
      if (AVar2 == aarch64) {
        uVar3 = 7;
      }
      *Major = uVar3;
    }
    break;
  case WatchOS:
    llvm_unreachable_internal
              ("conflicting triple info",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x441);
  }
  return;
}

Assistant:

void Triple::getiOSVersion(unsigned &Major, unsigned &Minor,
                           unsigned &Micro) const {
  switch (getOS()) {
  default: llvm_unreachable("unexpected OS for Darwin triple");
  case Darwin:
  case MacOSX:
    // Ignore the version from the triple.  This is only handled because the
    // the clang driver combines OS X and IOS support into a common Darwin
    // toolchain that wants to know the iOS version number even when targeting
    // OS X.
    Major = 5;
    Minor = 0;
    Micro = 0;
    break;
  case IOS:
  case TvOS:
    getOSVersion(Major, Minor, Micro);
    // Default to 5.0 (or 7.0 for arm64).
    if (Major == 0)
      Major = (getArch() == aarch64) ? 7 : 5;
    break;
  case WatchOS:
    llvm_unreachable("conflicting triple info");
  }
}